

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# network.c
# Opt level: O0

int lws_write_numeric_address(uint8_t *ads,int size,char *buf,size_t len)

{
  bool bVar1;
  bool bVar2;
  bool bVar3;
  ushort uVar4;
  int iVar5;
  char *pcVar6;
  undefined1 *puVar7;
  int local_4c;
  uint16_t v;
  int q;
  char *obuf;
  char *e;
  char ipv4;
  char n;
  char zb;
  char soe;
  char elided;
  char c;
  size_t len_local;
  char *buf_local;
  int size_local;
  uint8_t *ads_local;
  
  bVar2 = false;
  bVar1 = false;
  e._4_1_ = -1;
  bVar3 = false;
  pcVar6 = buf + len;
  local_4c = 0;
  if (size == 4) {
    ads_local._4_4_ =
         lws_snprintf(buf,len,"%u.%u.%u.%u",(ulong)*ads,(ulong)ads[1],(ulong)ads[2],(uint)ads[3]);
  }
  else if (size == 0x10) {
    len_local = (size_t)buf;
    for (e._7_1_ = '\0'; e._7_1_ < '\b'; e._7_1_ = e._7_1_ + '\x01') {
      uVar4 = CONCAT11(ads[local_4c],ads[local_4c + 1]);
      if (pcVar6 < (char *)(len_local + 8)) {
        return -1;
      }
      if (bVar1) {
        if (uVar4 != 0) {
          *(undefined1 *)len_local = 0x3a;
          len_local = len_local + 1;
        }
LAB_00116d44:
        if (bVar3) {
          iVar5 = lws_snprintf((char *)len_local,(long)pcVar6 - len_local,"%u.%u",
                               (ulong)ads[local_4c],(ulong)ads[local_4c + 1]);
          puVar7 = (undefined1 *)(len_local + (long)(int)(char)iVar5);
          len_local = (size_t)puVar7;
          if (e._7_1_ == '\x06') {
            len_local = (size_t)(puVar7 + 1);
            *puVar7 = 0x2e;
          }
        }
        else if ((!bVar1) || (uVar4 != 0)) {
          if (e._7_1_ != '\0') {
            *(undefined1 *)len_local = 0x3a;
            len_local = len_local + 1;
          }
          iVar5 = lws_snprintf((char *)len_local,(long)pcVar6 - len_local,"%x",(ulong)uVar4);
          len_local = len_local + (long)iVar5;
          if ((((bVar1) && (uVar4 != 0)) && (bVar1 = false, e._7_1_ == '\x05')) &&
             ((uVar4 == 0xffff && (e._4_1_ == '\0')))) {
            bVar3 = true;
            *(undefined1 *)len_local = 0x3a;
            len_local = (size_t)(len_local + 1);
          }
        }
      }
      else {
        if ((bVar2) || (uVar4 != 0)) goto LAB_00116d44;
        bVar1 = true;
        bVar2 = true;
        e._4_1_ = e._7_1_;
      }
      local_4c = local_4c + 2;
    }
    if (pcVar6 < (char *)(len_local + 3)) {
      ads_local._4_4_ = -1;
    }
    else {
      if (bVar1) {
        puVar7 = (undefined1 *)(len_local + 1);
        *(undefined1 *)len_local = 0x3a;
        len_local = len_local + 2;
        *puVar7 = 0x3a;
        *(undefined1 *)len_local = 0;
      }
      ads_local._4_4_ = (int)len_local - (int)buf;
    }
  }
  else {
    ads_local._4_4_ = -1;
  }
  return ads_local._4_4_;
}

Assistant:

int
lws_write_numeric_address(const uint8_t *ads, int size, char *buf, size_t len)
{
	char c, elided = 0, soe = 0, zb = -1, n, ipv4 = 0;
	const char *e = buf + len;
	char *obuf = buf;
	int q = 0;

	if (size == 4)
		return lws_snprintf(buf, len, "%u.%u.%u.%u",
				    ads[0], ads[1], ads[2], ads[3]);

	if (size != 16)
		return -1;

	for (c = 0; c < (char)size / 2; c++) {
		uint16_t v = (ads[q] << 8) | ads[q + 1];

		if (buf + 8 > e)
			return -1;

		q += 2;
		if (soe) {
			if (v)
				*buf++ = ':';
				/* fall thru to print hex value */
		} else
			if (!elided && !soe && !v) {
				elided = soe = 1;
				zb = c;
				continue;
			}

		if (ipv4) {
			n = lws_snprintf(buf, e - buf, "%u.%u",
					ads[q - 2], ads[q - 1]);
			buf += n;
			if (c == 6)
				*buf++ = '.';
		} else {
			if (soe && !v)
				continue;
			if (c)
				*buf++ = ':';

			buf += lws_snprintf(buf, e - buf, "%x", v);

			if (soe && v) {
				soe = 0;
				if (c == 5 && v == 0xffff && !zb) {
					ipv4 = 1;
					*buf++ = ':';
				}
			}
		}
	}
	if (buf + 3 > e)
		return -1;

	if (soe) { /* as is the case for all zeros */
		*buf++ = ':';
		*buf++ = ':';
		*buf = '\0';
	}

	return lws_ptr_diff(buf, obuf);
}